

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_bfins_32_di(void)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  sbyte sVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
    return;
  }
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar7 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar7 = pmmu_translate_addr(uVar7);
  }
  uVar3 = m68k_read_memory_16(uVar7 & m68ki_cpu.address_mask);
  iVar1 = *(int *)((long)m68ki_cpu.dar + (ulong)(uVar3 >> 10 & 0x1c));
  uVar7 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar8 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar8 = pmmu_translate_addr(uVar8);
  }
  uVar4 = m68k_read_memory_16(uVar8 & m68ki_cpu.address_mask);
  if ((uVar3 >> 0xb & 1) == 0) {
    uVar8 = uVar3 >> 6 & 0x1f;
  }
  else {
    uVar8 = m68ki_cpu.dar[uVar3 >> 6 & 7];
  }
  if ((uVar3 & 0x20) != 0) {
    uVar3 = m68ki_cpu.dar[uVar3 & 7];
  }
  uVar10 = uVar8 + 7;
  if (-1 < (int)uVar8) {
    uVar10 = uVar8;
  }
  uVar9 = (int)(short)uVar4 + uVar7 + ((int)uVar10 >> 3) + -1 +
          (uint)((uVar8 & 0x80000007) < 0x80000001);
  uVar11 = uVar3 - 1 & 0x1f;
  bVar2 = (byte)uVar11 ^ 0x1f;
  uVar10 = -1 << bVar2;
  sVar6 = (sbyte)(uVar8 & 7);
  uVar4 = iVar1 << bVar2;
  m68ki_cpu.n_flag = uVar4 >> 0x18;
  m68ki_cpu.not_z_flag = uVar4;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar7 = uVar9;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar7 = pmmu_translate_addr(uVar9);
  }
  uVar5 = m68k_read_memory_32(uVar7 & m68ki_cpu.address_mask);
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  uVar7 = uVar9;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar7 = pmmu_translate_addr(uVar9);
  }
  m68k_write_memory_32(uVar7 & m68ki_cpu.address_mask,~(uVar10 >> sVar6) & uVar5 | uVar4 >> sVar6);
  if (0x20 < (uVar8 & 7) + uVar11 + 1) {
    uVar10 = uVar10 & 0xff;
    uVar9 = uVar9 + 4;
    my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
    uVar7 = uVar9;
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar7 = pmmu_translate_addr(uVar9);
    }
    uVar11 = m68k_read_memory_8(uVar7 & m68ki_cpu.address_mask);
    m68ki_cpu.not_z_flag = m68ki_cpu.not_z_flag | uVar11 & uVar10;
    my_fc_handler(m68ki_cpu.s_flag | 1);
    if (m68ki_cpu.pmmu_enabled != 0) {
      uVar9 = pmmu_translate_addr(uVar9);
    }
    m68k_write_memory_8(uVar9 & m68ki_cpu.address_mask,~uVar10 & uVar11 | uVar4 & 0xff);
    return;
  }
  return;
}

Assistant:

static void m68k_op_bfins_32_di(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		uint width = word2;
		uint insert_base = REG_D[(word2>>12)&7];
		uint insert_long;
		uint insert_byte;
		uint mask_base;
		uint data_long;
		uint mask_long;
		uint data_byte = 0;
		uint mask_byte = 0;
		uint ea = EA_AY_DI_8();


		if(BIT_B(word2))
			offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		offset %= 8;
		if(offset < 0)
		{
			offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;

		mask_base = MASK_OUT_ABOVE_32(0xffffffff << (32 - width));
		mask_long = mask_base >> offset;

		insert_base = MASK_OUT_ABOVE_32(insert_base << (32 - width));
		FLAG_N = NFLAG_32(insert_base);
		FLAG_Z = insert_base;
		insert_long = insert_base >> offset;

		data_long = m68ki_read_32(ea);
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		m68ki_write_32(ea, (data_long & ~mask_long) | insert_long);

		if((width + offset) > 32)
		{
			mask_byte = MASK_OUT_ABOVE_8(mask_base);
			insert_byte = MASK_OUT_ABOVE_8(insert_base);
			data_byte = m68ki_read_8(ea+4);
			FLAG_Z |= (data_byte & mask_byte);
			m68ki_write_8(ea+4, (data_byte & ~mask_byte) | insert_byte);
		}
		return;
	}
	m68ki_exception_illegal();
}